

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
CheckAndStoreTopologySplitEvent
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          int src_symbol_id,int param_2,EdgeFaceName src_edge,int neighbor_face_id)

{
  pointer *ppTVar1;
  iterator __position;
  TopologySplitEventData event_data;
  TopologySplitEventData local_24;
  
  local_24.split_symbol_id = GetSplitSymbolIdOnFace(this,neighbor_face_id);
  if (local_24.split_symbol_id != 0xffffffff) {
    local_24._8_1_ = local_24._8_1_ & ~RIGHT_FACE_EDGE | src_edge & RIGHT_FACE_EDGE;
    __position._M_current =
         (this->topology_split_event_data_).
         super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->topology_split_event_data_).
        super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_24.source_symbol_id = src_symbol_id;
      std::vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>::
      _M_realloc_insert<draco::TopologySplitEventData_const&>
                ((vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>
                  *)&this->topology_split_event_data_,__position,&local_24);
    }
    else {
      *(undefined4 *)&(__position._M_current)->field_0x8 = local_24._8_4_;
      (__position._M_current)->split_symbol_id = local_24.split_symbol_id;
      (__position._M_current)->source_symbol_id = src_symbol_id;
      ppTVar1 = &(this->topology_split_event_data_).
                 super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoderImpl<
    TraversalEncoder>::CheckAndStoreTopologySplitEvent(int src_symbol_id,
                                                       int /* src_face_id */,
                                                       EdgeFaceName src_edge,
                                                       int neighbor_face_id) {
  const int symbol_id = GetSplitSymbolIdOnFace(neighbor_face_id);
  if (symbol_id == -1) {
    return;  // Not a split symbol, no topology split event could happen.
  }
  TopologySplitEventData event_data;

  event_data.split_symbol_id = symbol_id;
  event_data.source_symbol_id = src_symbol_id;
  event_data.source_edge = src_edge;
  topology_split_event_data_.push_back(event_data);
}